

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenutypes.cpp
# Opt level: O0

QDBusArgument * operator>>(QDBusArgument *arg,QDBusMenuLayoutItem *item)

{
  byte bVar1;
  QMap<QString,_QVariant> *in_RSI;
  QDBusArgument *in_RDI;
  long in_FS_OFFSET;
  QDBusMenuLayoutItem child;
  QDBusArgument childArgument;
  QDBusVariant dbusVariant;
  parameter_type in_stack_ffffffffffffff68;
  QDBusMenuLayoutItem *in_stack_ffffffffffffff70;
  QVariant *in_stack_ffffffffffffff88;
  QDBusArgument local_50;
  QVariant local_48;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::beginStructure();
  QDBusArgument::operator>>(in_RDI,(int *)in_RSI);
  operator>><QMap,_QString,_QVariant,_true>(in_RDI,in_RSI);
  QDBusArgument::beginArray();
  while( true ) {
    bVar1 = QDBusArgument::atEnd();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QDBusVariant::QDBusVariant((QDBusVariant *)0xaf630f);
    QDBusArgument::operator>>(in_RDI,(QDBusVariant *)&local_28);
    local_50.d = (QDBusArgumentPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    QDBusVariant::variant((QDBusVariant *)in_stack_ffffffffffffff68);
    qvariant_cast<QDBusArgument>(in_stack_ffffffffffffff88);
    QVariant::~QVariant(&local_48);
    memset(&stack0xffffffffffffff88,0xaa,0x28);
    QDBusMenuLayoutItem::QDBusMenuLayoutItem(in_stack_ffffffffffffff70);
    operator>>((QDBusArgument *)in_RSI,in_stack_ffffffffffffff70);
    QList<QDBusMenuLayoutItem>::append
              ((QList<QDBusMenuLayoutItem> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    QDBusMenuLayoutItem::~QDBusMenuLayoutItem(in_stack_ffffffffffffff70);
    QDBusArgument::~QDBusArgument(&local_50);
    QDBusVariant::~QDBusVariant((QDBusVariant *)0xaf63b0);
  }
  QDBusArgument::endArray();
  QDBusArgument::endStructure();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

const QDBusArgument &operator>>(const QDBusArgument &arg, QDBusMenuLayoutItem &item)
{
    arg.beginStructure();
    arg >> item.m_id >> item.m_properties;
    arg.beginArray();
    while (!arg.atEnd()) {
        QDBusVariant dbusVariant;
        arg >> dbusVariant;
        QDBusArgument childArgument = qvariant_cast<QDBusArgument>(dbusVariant.variant());

        QDBusMenuLayoutItem child;
        childArgument >> child;
        item.m_children.append(child);
    }
    arg.endArray();
    arg.endStructure();
    return arg;
}